

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

void __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
::~lexer(lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<const_char_*>_>
         *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  pcVar2 = (this->token_buffer)._M_dataplus._M_p;
  paVar1 = &(this->token_buffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->token_string).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
    return;
  }
  return;
}

Assistant:

~lexer() = default;